

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::FileDescriptorTables::AddAliasUnderParent
          (FileDescriptorTables *this,void *parent,string_view name,Symbol symbol)

{
  ctrl_t *pcVar1;
  ctrl_t *pcVar2;
  long lVar3;
  ulong uVar4;
  undefined8 uVar5;
  uint uVar6;
  ctrl_t cVar7;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  bool bVar31;
  ushort uVar33;
  int iVar34;
  Symbol *key;
  char cVar32;
  anon_union_8_1_a8a14541_for_iterator_2 aVar35;
  ctrl_t *pcVar36;
  slot_type *psVar37;
  ctrl_t *pcVar38;
  size_t sVar39;
  anon_union_8_1_a8a14541_for_iterator_2 aVar40;
  reference key_00;
  MixingHashState MVar41;
  undefined7 extraout_var;
  string *psVar42;
  uint uVar43;
  Symbol *b;
  Symbol *b_00;
  Symbol *b_01;
  Symbol *b_02;
  ulong uVar44;
  size_t cap;
  ulong uVar45;
  pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> *__return_storage_ptr__
  ;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  iterator iVar50;
  iterator iVar51;
  iterator iVar52;
  iterator iVar53;
  FindInfo FVar54;
  __m128i match;
  __m128i match_1;
  ctrl_t *local_110;
  Symbol local_100;
  undefined8 local_f8;
  ctrl_t cStack_f0;
  ctrl_t cStack_ef;
  ctrl_t cStack_ee;
  ctrl_t cStack_ed;
  ctrl_t cStack_ec;
  ctrl_t cStack_eb;
  ctrl_t cStack_ea;
  ctrl_t cStack_e9;
  ctrl_t *local_e0;
  pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> local_d8;
  anon_union_8_1_a8a14541_for_iterator_2 local_c0;
  anon_union_8_1_a8a14541_for_iterator_2 local_b8;
  uint local_ac;
  undefined1 local_a8 [16];
  slot_type *local_98;
  ctrl_t *local_90;
  ctrl_t *local_88;
  ctrl_t *local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  ctrl_t local_68;
  ctrl_t cStack_67;
  ctrl_t cStack_66;
  ctrl_t cStack_65;
  ctrl_t cStack_64;
  ctrl_t cStack_63;
  ctrl_t cStack_62;
  ctrl_t cStack_61;
  ctrl_t cStack_60;
  ctrl_t cStack_5f;
  ctrl_t cStack_5e;
  ctrl_t cStack_5d;
  ctrl_t cStack_5c;
  ctrl_t cStack_5b;
  ctrl_t cStack_5a;
  ctrl_t cStack_59;
  const_iterator local_50;
  iterator local_40;
  
  pcVar38 = name._M_str;
  local_98 = (slot_type *)name._M_len;
  local_100.ptr_ = symbol.ptr_;
  local_90 = pcVar38;
  Symbol::parent_name_key(&local_d8,&local_100);
  if ((local_98 == (slot_type *)local_d8.second._M_len) &&
     ((local_98 == (slot_type *)0x0 ||
      (iVar34 = bcmp(local_90,local_d8.second._M_str,(size_t)local_98), iVar34 == 0)))) {
    psVar42 = (string *)0x0;
  }
  else {
    psVar42 = absl::lts_20240722::log_internal::
              MakeCheckOpString<std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const&>
                        ((basic_string_view *)&local_98,(basic_string_view *)&local_d8.second,
                         "name == symbol.parent_name_key().second");
  }
  if (psVar42 == (string *)0x0) {
    aVar40.slot_ = (slot_type *)&local_d8;
    Symbol::parent_name_key
              ((pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> *)
               aVar40.slot_,&local_100);
    if (local_d8.first == parent) {
      psVar42 = (string *)0x0;
    }
    else {
      psVar42 = absl::lts_20240722::log_internal::MakeCheckOpString<void_const*,void_const*>
                          (parent,local_d8.first,"parent == symbol.parent_name_key().first");
    }
    if (psVar42 == (string *)0x0) {
      absl::lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
      ::AssertHashEqConsistent<google::protobuf::Symbol>
                ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  *)this,&local_100);
      lVar3 = (this->symbols_by_parent_).
              super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
              .settings_.
              super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value
              .capacity_;
      if (lVar3 == 1) {
        if ((this->symbols_by_parent_).
            super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
            .settings_.
            super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
            size_ < 2) {
          absl::lts_20240722::container_internal::CommonFields::AssertInSooMode
                    ((CommonFields *)this);
          (this->symbols_by_parent_).
          super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
          size_ = 2;
          aVar40.slot_ = absl::lts_20240722::container_internal::
                         raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                         ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                     *)this);
          iVar52.field_1.slot_ = aVar40.slot_;
          iVar52.ctrl_ = (ctrl_t *)aVar40;
          pcVar38 = (ctrl_t *)&absl::lts_20240722::container_internal::kSooControl;
        }
        else {
          psVar37 = absl::lts_20240722::container_internal::
                    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                *)this);
          bVar31 = (anonymous_namespace)::SymbolByParentEq::operator()(psVar37,&local_100,b_00);
          if (bVar31) {
            aVar40.slot_ = absl::lts_20240722::container_internal::
                           raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                           ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                       *)this);
            iVar51.field_1.slot_ = aVar40.slot_;
            iVar51.ctrl_ = (ctrl_t *)&absl::lts_20240722::container_internal::kSooControl;
LAB_001dd409:
            uVar45 = 0;
            goto LAB_001dd463;
          }
          absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
          ::resize_impl(this,3);
          Symbol::parent_name_key(&local_d8,&local_100);
          MVar41 = absl::lts_20240722::hash_internal::
                   HashStateBase<absl::lts_20240722::hash_internal::MixingHashState>::
                   combine<void_const*,std::basic_string_view<char,std::char_traits<char>>>
                             ((MixingHashState)
                              &absl::lts_20240722::hash_internal::MixingHashState::kSeed,
                              &local_d8.first,&local_d8.second);
          sVar39 = absl::lts_20240722::container_internal::PrepareInsertAfterSoo
                             (MVar41.state_,8,(CommonFields *)this);
          iVar52 = absl::lts_20240722::container_internal::
                   raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                   ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                  *)this,sVar39);
          pcVar38 = iVar52.ctrl_;
        }
        iVar51.field_1 =
             (anon_union_8_1_a8a14541_for_iterator_2)
             (anon_union_8_1_a8a14541_for_iterator_2)iVar52.field_1.slot_;
        iVar51.ctrl_ = pcVar38;
        uVar45 = CONCAT71(iVar52.ctrl_._1_7_,1);
      }
      else {
        if (lVar3 == 0) goto LAB_001dd74c;
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
        ::prefetch_heap_block
                  ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    *)this);
        Symbol::parent_name_key(&local_d8,&local_100);
        aVar35 = (anon_union_8_1_a8a14541_for_iterator_2)
                 absl::lts_20240722::hash_internal::
                 HashStateBase<absl::lts_20240722::hash_internal::MixingHashState>::
                 combine<void_const*,std::basic_string_view<char,std::char_traits<char>>>
                           ((MixingHashState)
                            &absl::lts_20240722::hash_internal::MixingHashState::kSeed,
                            &local_d8.first,&local_d8.second);
        uVar4 = (this->symbols_by_parent_).
                super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                value.capacity_;
        if ((uVar4 + 1 & uVar4) != 0) goto LAB_001dd728;
        uVar44 = ((ulong)aVar35.slot_ >> 7 ^
                 (ulong)(this->symbols_by_parent_).
                        super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                        .settings_.
                        super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                        .value.heap_or_soo_.heap.control >> 0xc) & uVar4;
        pcVar36 = absl::lts_20240722::container_internal::
                  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  ::control((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                             *)this);
        auVar46 = ZEXT216(CONCAT11(aVar35._0_1_,aVar35._0_1_) & 0x7f7f);
        auVar46 = pshuflw(auVar46,auVar46,0);
        local_a8._0_4_ = auVar46._0_4_;
        local_a8._4_4_ = local_a8._0_4_;
        local_a8._8_4_ = local_a8._0_4_;
        local_a8._12_4_ = local_a8._0_4_;
        local_110 = (ctrl_t *)0x0;
        do {
          pcVar2 = pcVar36 + uVar44;
          auVar46[0] = -(local_a8[0] == *pcVar2);
          auVar46[1] = -(local_a8[1] == pcVar2[1]);
          auVar46[2] = -(local_a8[2] == pcVar2[2]);
          auVar46[3] = -(local_a8[3] == pcVar2[3]);
          auVar46[4] = -(local_a8[4] == pcVar2[4]);
          auVar46[5] = -(local_a8[5] == pcVar2[5]);
          auVar46[6] = -(local_a8[6] == pcVar2[6]);
          auVar46[7] = -(local_a8[7] == pcVar2[7]);
          auVar46[8] = -(local_a8[8] == pcVar2[8]);
          auVar46[9] = -(local_a8[9] == pcVar2[9]);
          auVar46[10] = -(local_a8[10] == pcVar2[10]);
          auVar46[0xb] = -(local_a8[0xb] == pcVar2[0xb]);
          auVar46[0xc] = -(local_a8[0xc] == pcVar2[0xc]);
          auVar46[0xd] = -(local_a8[0xd] == pcVar2[0xd]);
          auVar46[0xe] = -(local_a8[0xe] == pcVar2[0xe]);
          auVar46[0xf] = -(local_a8[0xf] == pcVar2[0xf]);
          uVar33 = (ushort)(SUB161(auVar46 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar46[0xf] >> 7) << 0xf;
          uVar43 = (uint)uVar33;
          local_c0 = aVar40;
          cVar7 = *pcVar2;
          cVar8 = pcVar2[1];
          cVar9 = pcVar2[2];
          cVar10 = pcVar2[3];
          cVar11 = pcVar2[4];
          cVar12 = pcVar2[5];
          cVar13 = pcVar2[6];
          cVar14 = pcVar2[7];
          cVar23 = pcVar2[8];
          cVar24 = pcVar2[9];
          cVar25 = pcVar2[10];
          cVar26 = pcVar2[0xb];
          cVar27 = pcVar2[0xc];
          cVar28 = pcVar2[0xd];
          cVar29 = pcVar2[0xe];
          cVar30 = pcVar2[0xf];
          uVar5 = local_f8;
          cVar15 = cStack_f0;
          cVar16 = cStack_ef;
          cVar17 = cStack_ee;
          cVar18 = cStack_ed;
          cVar19 = cStack_ec;
          cVar20 = cStack_eb;
          cVar21 = cStack_ea;
          cVar22 = cStack_e9;
          local_f8 = *(undefined8 *)pcVar2;
          while (cStack_e9 = cVar30, cStack_ea = cVar29, cStack_eb = cVar28, cStack_ec = cVar27,
                cStack_ed = cVar26, cStack_ee = cVar25, cStack_ef = cVar24, cStack_f0 = cVar23,
                uVar33 != 0) {
            uVar6 = 0;
            if (uVar43 != 0) {
              for (; (uVar43 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
              }
            }
            local_e0 = pcVar36;
            local_b8 = aVar35;
            psVar37 = absl::lts_20240722::container_internal::
                      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      ::slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                    *)this);
            uVar45 = uVar6 + uVar44 & uVar4;
            bVar31 = (anonymous_namespace)::SymbolByParentEq::operator()
                               (psVar37 + uVar45,&local_100,b);
            if (bVar31) {
              iVar51 = absl::lts_20240722::container_internal::
                       raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                       ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                      *)this,uVar45);
              goto LAB_001dd409;
            }
            uVar33 = (ushort)(uVar43 - 1) & (ushort)uVar43;
            uVar43 = CONCAT22((short)(uVar43 - 1 >> 0x10),uVar33);
            aVar35 = local_b8;
            pcVar36 = local_e0;
            cVar7 = (ctrl_t)local_f8;
            cVar8 = local_f8._1_1_;
            cVar9 = local_f8._2_1_;
            cVar10 = local_f8._3_1_;
            cVar11 = local_f8._4_1_;
            cVar12 = local_f8._5_1_;
            cVar13 = local_f8._6_1_;
            cVar14 = local_f8._7_1_;
            cVar23 = cStack_f0;
            cVar24 = cStack_ef;
            cVar25 = cStack_ee;
            cVar26 = cStack_ed;
            cVar27 = cStack_ec;
            cVar28 = cStack_eb;
            cVar29 = cStack_ea;
            cVar30 = cStack_e9;
            uVar5 = local_f8;
            cVar15 = cStack_f0;
            cVar16 = cStack_ef;
            cVar17 = cStack_ee;
            cVar18 = cStack_ed;
            cVar19 = cStack_ec;
            cVar20 = cStack_eb;
            cVar21 = cStack_ea;
            cVar22 = cStack_e9;
          }
          auVar49[0] = -(cVar7 == kEmpty);
          auVar49[1] = -(cVar8 == kEmpty);
          auVar49[2] = -(cVar9 == kEmpty);
          auVar49[3] = -(cVar10 == kEmpty);
          auVar49[4] = -(cVar11 == kEmpty);
          auVar49[5] = -(cVar12 == kEmpty);
          auVar49[6] = -(cVar13 == kEmpty);
          auVar49[7] = -(cVar14 == kEmpty);
          auVar49[8] = -(cStack_f0 == kEmpty);
          auVar49[9] = -(cStack_ef == kEmpty);
          auVar49[10] = -(cStack_ee == kEmpty);
          auVar49[0xb] = -(cStack_ed == kEmpty);
          auVar49[0xc] = -(cStack_ec == kEmpty);
          auVar49[0xd] = -(cStack_eb == kEmpty);
          auVar49[0xe] = -(cStack_ea == kEmpty);
          auVar49[0xf] = -(cStack_e9 == kEmpty);
          pcVar2 = (ctrl_t *)
                   (this->symbols_by_parent_).
                   super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                   value.capacity_;
          uVar43 = (uint)(ushort)((ushort)(SUB161(auVar49 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(auVar49[0xf] >> 7) << 0xf);
          local_f8 = CONCAT44((int)((ulong)uVar5 >> 0x20),uVar43);
          cStack_f0 = cVar15;
          cStack_ef = cVar16;
          cStack_ee = cVar17;
          cStack_ed = cVar18;
          cStack_ec = cVar19;
          cStack_eb = cVar20;
          cStack_ea = cVar21;
          cStack_e9 = cVar22;
          if (uVar43 == 0) {
            if (pcVar2 == (ctrl_t *)0x0) goto LAB_001dd74c;
            pcVar1 = local_110 + 0x10;
            if (pcVar2 < pcVar1) {
              __assert_fail("seq.index() <= capacity() && \"full table!\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0xef5,
                            "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                           );
            }
            uVar44 = (ulong)(local_110 + uVar44 + 0x10) & uVar4;
            iVar50.field_1.slot_ = local_c0.slot_;
            iVar50.ctrl_ = pcVar1;
            local_110 = pcVar1;
          }
          else {
            if (pcVar2 == (ctrl_t *)0x0) goto LAB_001dd74c;
            pcVar38 = absl::lts_20240722::container_internal::
                      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      ::control((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                 *)this);
            cVar32 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                               ((ulong)pcVar2,(ulong)aVar35,pcVar38);
            if (cVar32 == '\0') {
              uVar43 = 0;
              if ((uint)local_f8 != 0) {
                for (; ((uint)local_f8 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                }
              }
            }
            else {
              uVar33 = 0xf;
              if ((ushort)local_f8 != 0) {
                for (; (ushort)local_f8 >> uVar33 == 0; uVar33 = uVar33 - 1) {
                }
              }
              uVar43 = (ushort)((uVar33 ^ 0xfff0) + 0x11) - 1;
            }
            FVar54.offset = uVar43 + uVar44 & uVar4;
            FVar54.probe_length = (size_t)local_110;
            sVar39 = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                               ((CommonFields *)this,(ulong)aVar35,FVar54,
                                (PolicyFunctions *)
                                absl::lts_20240722::container_internal::
                                raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByParentHash,google::protobuf::(anonymous_namespace)::SymbolByParentEq,std::allocator<google::protobuf::Symbol>>
                                ::GetPolicyFunctions()::value);
            iVar50 = absl::lts_20240722::container_internal::
                     raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                     ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                    *)this,sVar39);
            pcVar38 = iVar50.ctrl_;
          }
          aVar40 = iVar50.field_1;
          iVar51.field_1.slot_ = aVar40.slot_;
          iVar51.ctrl_ = pcVar38;
          uVar45 = CONCAT71(iVar50.ctrl_._1_7_,1);
        } while ((ushort)local_f8 == 0);
      }
LAB_001dd463:
      aVar40 = iVar51.field_1;
      local_88 = iVar51.ctrl_;
      if ((char)uVar45 == '\0') goto LAB_001dd6e8;
      local_ac = (uint)uVar45;
      (aVar40.slot_)->ptr_ = local_100.ptr_;
      local_40 = iVar51;
      key_00 = absl::lts_20240722::container_internal::
               raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
               ::iterator::operator*(&local_40);
      absl::lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
      ::AssertHashEqConsistent<google::protobuf::Symbol>
                ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  *)this,key_00);
      lVar3 = (this->symbols_by_parent_).
              super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
              .settings_.
              super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value
              .capacity_;
      if (lVar3 == 1) {
        local_d8.second._M_len = 1;
        local_50.inner_.field_1 = aVar40;
        if (1 < (this->symbols_by_parent_).
                super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                value.size_) {
          psVar37 = absl::lts_20240722::container_internal::
                    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                *)this);
          local_d8.second._M_len._0_1_ =
               (anonymous_namespace)::SymbolByParentEq::operator()(psVar37,key_00,b_02);
          local_d8.second._M_len._1_7_ = extraout_var;
          if (local_d8.second._M_len._0_1_) {
            local_d8.second._M_len =
                 (size_t)absl::lts_20240722::container_internal::
                         raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                         ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                     *)this);
            __return_storage_ptr__ =
                 (pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> *)
                 &absl::lts_20240722::container_internal::kSooControl;
            goto LAB_001dd6b4;
          }
        }
        __return_storage_ptr__ =
             (pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> *)0x0;
      }
      else {
        local_c0 = aVar40;
        if (lVar3 == 0) {
LAB_001dd74c:
          __assert_fail("!kEnabled || cap >= kCapacity",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xb37,
                        "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                       );
        }
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
        ::prefetch_heap_block
                  ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    *)this);
        __return_storage_ptr__ = &local_d8;
        Symbol::parent_name_key(__return_storage_ptr__,key_00);
        MVar41 = absl::lts_20240722::hash_internal::
                 HashStateBase<absl::lts_20240722::hash_internal::MixingHashState>::
                 combine<void_const*,std::basic_string_view<char,std::char_traits<char>>>
                           ((MixingHashState)
                            &absl::lts_20240722::hash_internal::MixingHashState::kSeed,
                            &__return_storage_ptr__->first,&local_d8.second);
        uVar5 = (this->symbols_by_parent_).
                super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                value.capacity_;
        if (uVar5 == ~kDeleted) {
          __assert_fail("!is_soo()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xdb0,
                        "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                       );
        }
        if (uVar5 == ~kSentinel) goto LAB_001dd74c;
        if ((uVar5 + ~kDeleted & uVar5) != ~kSentinel) goto LAB_001dd728;
        local_a8._0_8_ = uVar5;
        local_f8 = (MVar41.state_ >> 7 ^
                   (ulong)(this->symbols_by_parent_).
                          super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                          .settings_.
                          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                          .value.heap_or_soo_.heap.control >> 0xc) & uVar5;
        local_80 = absl::lts_20240722::container_internal::
                   raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                   ::control((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                              *)this);
        auVar46 = ZEXT216(CONCAT11((char)MVar41.state_,(char)MVar41.state_) & 0x7f7f);
        auVar46 = pshuflw(auVar46,auVar46,0);
        local_78 = auVar46._0_4_;
        pcVar38 = (ctrl_t *)0x0;
        uStack_74 = local_78;
        uStack_70 = local_78;
        uStack_6c = local_78;
        do {
          pcVar36 = local_80 + local_f8;
          local_68 = *pcVar36;
          cStack_67 = pcVar36[1];
          cStack_66 = pcVar36[2];
          cStack_65 = pcVar36[3];
          cStack_64 = pcVar36[4];
          cStack_63 = pcVar36[5];
          cStack_62 = pcVar36[6];
          cStack_61 = pcVar36[7];
          cStack_60 = pcVar36[8];
          cStack_5f = pcVar36[9];
          cStack_5e = pcVar36[10];
          cStack_5d = pcVar36[0xb];
          cStack_5c = pcVar36[0xc];
          cStack_5b = pcVar36[0xd];
          cStack_5a = pcVar36[0xe];
          cStack_59 = pcVar36[0xf];
          auVar47[0] = -((ctrl_t)local_78 == local_68);
          auVar47[1] = -(local_78._1_1_ == cStack_67);
          auVar47[2] = -(local_78._2_1_ == cStack_66);
          auVar47[3] = -(local_78._3_1_ == cStack_65);
          auVar47[4] = -((ctrl_t)uStack_74 == cStack_64);
          auVar47[5] = -(uStack_74._1_1_ == cStack_63);
          auVar47[6] = -(uStack_74._2_1_ == cStack_62);
          auVar47[7] = -(uStack_74._3_1_ == cStack_61);
          auVar47[8] = -((ctrl_t)uStack_70 == cStack_60);
          auVar47[9] = -(uStack_70._1_1_ == cStack_5f);
          auVar47[10] = -(uStack_70._2_1_ == cStack_5e);
          auVar47[0xb] = -(uStack_70._3_1_ == cStack_5d);
          auVar47[0xc] = -((ctrl_t)uStack_6c == cStack_5c);
          auVar47[0xd] = -(uStack_6c._1_1_ == cStack_5b);
          auVar47[0xe] = -(uStack_6c._2_1_ == cStack_5a);
          auVar47[0xf] = -(uStack_6c._3_1_ == cStack_59);
          uVar33 = (ushort)(SUB161(auVar47 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar47[0xf] >> 7) << 0xf;
          uVar43 = (uint)uVar33;
          local_e0 = pcVar38;
          while( true ) {
            iVar53.field_1 =
                 (anon_union_8_1_a8a14541_for_iterator_2)
                 (anon_union_8_1_a8a14541_for_iterator_2)local_b8.slot_;
            iVar53.ctrl_ = (ctrl_t *)__return_storage_ptr__;
            if (uVar33 == 0) break;
            uVar6 = 0;
            if (uVar43 != 0) {
              for (; (uVar43 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
              }
            }
            psVar37 = absl::lts_20240722::container_internal::
                      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      ::slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                    *)this);
            uVar45 = (ulong)uVar6 + local_f8 & local_a8._0_8_;
            bVar31 = (anonymous_namespace)::SymbolByParentEq::operator()
                               (psVar37 + uVar45,key_00,b_01);
            if (bVar31) {
              iVar53 = absl::lts_20240722::container_internal::
                       raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                       ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                      *)this,uVar45);
              break;
            }
            uVar33 = (ushort)(uVar43 - 1) & (ushort)uVar43;
            uVar43 = CONCAT22((short)(uVar43 - 1 >> 0x10),uVar33);
          }
          local_b8 = iVar53.field_1;
          __return_storage_ptr__ =
               (pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> *)
               iVar53.ctrl_;
          pcVar38 = local_e0;
          if (uVar33 != 0) {
            bVar31 = false;
          }
          else {
            auVar48[0] = -(local_68 == kEmpty);
            auVar48[1] = -(cStack_67 == kEmpty);
            auVar48[2] = -(cStack_66 == kEmpty);
            auVar48[3] = -(cStack_65 == kEmpty);
            auVar48[4] = -(cStack_64 == kEmpty);
            auVar48[5] = -(cStack_63 == kEmpty);
            auVar48[6] = -(cStack_62 == kEmpty);
            auVar48[7] = -(cStack_61 == kEmpty);
            auVar48[8] = -(cStack_60 == kEmpty);
            auVar48[9] = -(cStack_5f == kEmpty);
            auVar48[10] = -(cStack_5e == kEmpty);
            auVar48[0xb] = -(cStack_5d == kEmpty);
            auVar48[0xc] = -(cStack_5c == kEmpty);
            auVar48[0xd] = -(cStack_5b == kEmpty);
            auVar48[0xe] = -(cStack_5a == kEmpty);
            auVar48[0xf] = -(cStack_59 == kEmpty);
            if ((((((((((((((((auVar48 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                             (auVar48 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar48 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar48 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar48 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar48 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar48 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar48 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar48 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar48 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar48 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar48 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar48 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar48 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar48 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar48[0xf]) {
              pcVar38 = (ctrl_t *)
                        (this->symbols_by_parent_).
                        super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                        .settings_.
                        super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                        .value.capacity_;
              if (pcVar38 == (ctrl_t *)0x0) goto LAB_001dd74c;
              if (pcVar38 < local_e0 + 0x10) {
                __assert_fail("seq.index() <= capacity() && \"full table!\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0xdbd,
                              "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                             );
              }
              local_f8 = (ulong)(local_e0 + local_f8 + 0x10) & local_a8._0_8_;
              bVar31 = true;
              pcVar38 = local_e0 + 0x10;
            }
            else {
              __return_storage_ptr__ =
                   (pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> *)0x0
              ;
              bVar31 = false;
            }
          }
          local_d8.second._M_len = (size_t)local_b8;
          local_50.inner_.field_1 = local_c0;
        } while (bVar31);
      }
LAB_001dd6b4:
      local_50.inner_.ctrl_ = local_88;
      local_d8.first = __return_storage_ptr__;
      bVar31 = absl::lts_20240722::container_internal::operator==
                         ((const_iterator *)&local_d8,&local_50);
      if (!bVar31) {
        __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf3f,
                      "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, Args = <const google::protobuf::Symbol &>]"
                     );
      }
      uVar45 = (ulong)local_ac;
LAB_001dd6e8:
      return SUB81(uVar45,0);
    }
  }
  else {
    AddAliasUnderParent();
  }
  AddAliasUnderParent();
LAB_001dd728:
  __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x145,
                "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
}

Assistant:

bool FileDescriptorTables::AddAliasUnderParent(const void* parent,
                                               absl::string_view name,
                                               Symbol symbol) {
  ABSL_DCHECK_EQ(name, symbol.parent_name_key().second);
  ABSL_DCHECK_EQ(parent, symbol.parent_name_key().first);
  return symbols_by_parent_.insert(symbol).second;
}